

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part_specifier.cpp
# Opt level: O3

DatePartSpecifier duckdb::GetDatePartSpecifier(string *specifier)

{
  pointer pcVar1;
  ConversionException *this;
  bool bVar2;
  DatePartSpecifier result;
  DatePartSpecifier local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar2 = TryGetDatePartSpecifier(specifier,&local_69);
  if (bVar2) {
    return local_69;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"extract specifier \"%s\" not recognized","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (specifier->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + specifier->_M_string_length);
  ConversionException::ConversionException<std::__cxx11::string>(this,&local_68,&local_48);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DatePartSpecifier GetDatePartSpecifier(const string &specifier) {
	DatePartSpecifier result;
	if (!TryGetDatePartSpecifier(specifier, result)) {
		throw ConversionException("extract specifier \"%s\" not recognized", specifier);
	}
	return result;
}